

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::ReservedNamesTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,ReservedNamesTest *this,_shader_type shader_type,
          _language_feature language_feature,char *invalid_name)

{
  uint uVar1;
  ostream *poVar2;
  TestError *this_00;
  char *pcVar3;
  stringstream body_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&body_sstream);
  uVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  std::operator<<(&local_1a8,"#version ");
  uVar1 = uVar1 & 0x3ff;
  if (uVar1 == 0x104) {
    pcVar3 = "400";
  }
  else if (uVar1 == 0x154) {
    pcVar3 = "450";
  }
  else if (uVar1 == 0x114) {
    pcVar3 = "410";
  }
  else if (uVar1 == 0x123) {
    pcVar3 = "150";
  }
  else if (uVar1 == 0x124) {
    pcVar3 = "420";
  }
  else if (uVar1 == 0x133) {
    pcVar3 = "330";
  }
  else if (uVar1 == 0x134) {
    pcVar3 = "430";
  }
  else if (uVar1 == 0x144) {
    pcVar3 = "440";
  }
  else {
    if (uVar1 != 0x113) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported GL context version - please implement",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                 ,0x1278);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar3 = "140";
  }
  std::operator<<(&local_1a8,pcVar3);
  std::operator<<(&local_1a8,"\n\n");
  if (shader_type == LANGUAGE_FEATURE_ATOMIC_COUNTER) {
    pcVar3 = "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n";
LAB_00ae9727:
    std::operator<<(&local_1a8,pcVar3);
  }
  else {
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_NAME) {
      pcVar3 = "layout(triangles) in;\n";
      goto LAB_00ae9727;
    }
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      pcVar3 = "layout(vertices = 3) out;\n";
      goto LAB_00ae9727;
    }
  }
  std::operator<<(&local_1a8,"\n\n");
  switch(language_feature) {
  case LANGUAGE_FEATURE_ATOMIC_COUNTER:
    pcVar3 = "layout(binding = 0, offset = 0) uniform atomic_uint ";
    goto LAB_00ae9a9a;
  case LANGUAGE_FEATURE_ATTRIBUTE:
    pcVar3 = "attribute vec4 ";
    goto LAB_00ae9a9a;
  case LANGUAGE_FEATURE_CONSTANT:
    poVar2 = std::operator<<(&local_1a8,"const vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = " = vec4(2.0, 3.0, 4.0, 5.0);\n";
    break;
  case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
    poVar2 = std::operator<<(&local_1a8,"void test(in vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = ")\n{\n}\n";
    break;
  case LANGUAGE_FEATURE_FUNCTION_NAME:
    poVar2 = std::operator<<(&local_1a8,"void ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = "(in vec4 test)\n{\n}\n";
    break;
  case LANGUAGE_FEATURE_INPUT:
    poVar2 = std::operator<<(&local_1a8,"in vec4 ");
    std::operator<<(poVar2,invalid_name);
    goto LAB_00ae99b9;
  case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
    poVar2 = std::operator<<(&local_1a8,"in testBlock\n{\n    vec4 test;\n} ");
    std::operator<<(poVar2,invalid_name);
    goto LAB_00ae99b9;
  case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
    poVar2 = std::operator<<(&local_1a8,"in testBlock\n{\n    vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    std::operator<<(poVar2,";\n} testBlockInstance");
    goto LAB_00ae99b9;
  case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
    poVar2 = std::operator<<(&local_1a8,"in ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    std::operator<<(poVar2,"\n{\n    vec4 test;\n} testBlockInstance");
LAB_00ae99b9:
    if (shader_type - LANGUAGE_FEATURE_CONSTANT < 3) {
LAB_00ae99c1:
      std::operator<<(&local_1a8,"[]");
    }
LAB_00ae99d0:
    pcVar3 = ";\n";
    poVar2 = &local_1a8;
    break;
  case LANGUAGE_FEATURE_OUTPUT:
    poVar2 = std::operator<<(&local_1a8,"out vec4 ");
    std::operator<<(poVar2,invalid_name);
    goto LAB_00ae9989;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
    poVar2 = std::operator<<(&local_1a8,"out testBlock\n{\n    vec4 test;\n} ");
    std::operator<<(poVar2,invalid_name);
    goto LAB_00ae9989;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
    poVar2 = std::operator<<(&local_1a8,"out testBlock\n{\n    vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    std::operator<<(poVar2,";\n} testBlockInstance");
    goto LAB_00ae9989;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
    poVar2 = std::operator<<(&local_1a8,"out ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    std::operator<<(poVar2,"\n{\n    vec4 test;\n} testBlockInstance");
LAB_00ae9989:
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) goto LAB_00ae99c1;
    goto LAB_00ae99d0;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
    pcVar3 = "buffer testBlock\n{\n    vec4 test;\n} ";
    goto LAB_00ae9a9a;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
    pcVar3 = "buffer testBlock\n{\n    vec4 ";
    goto LAB_00ae98d2;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
    pcVar3 = "buffer ";
    goto LAB_00ae98fb;
  default:
    goto switchD_00ae9759_caseD_10;
  case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
    poVar2 = std::operator<<(&local_1a8,"subroutine void exampleSubroutine(inout vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    poVar2 = std::operator<<(poVar2,");\n\nsubroutine (exampleSubroutine) void invert(inout vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    poVar2 = std::operator<<(poVar2,")\n{\n    ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = 
    " += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform exampleSubroutine testSubroutine;\n";
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
    poVar2 = std::operator<<(&local_1a8,"subroutine void ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    poVar2 = std::operator<<(poVar2,"(inout vec4 arg);\n\nsubroutine (");
    poVar2 = std::operator<<(poVar2,invalid_name);
    poVar2 = std::operator<<(poVar2,
                             ") void invert(inout vec4 arg)\n{\n    arg += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform "
                            );
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = " testSubroutine;\n";
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
    pcVar3 = 
    "subroutine void exampleSubroutine(inout vec4 arg);\n\nsubroutine (exampleSubroutine) void invert(inout vec4 arg)\n{\n    arg += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform exampleSubroutine "
    ;
    goto LAB_00ae9a9a;
  case LANGUAGE_FEATURE_UNIFORM:
    pcVar3 = "uniform sampler2D ";
    goto LAB_00ae9a9a;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
    pcVar3 = "uniform testBlock\n{\n    vec4 test;\n} ";
    goto LAB_00ae9a9a;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
    pcVar3 = "uniform testBlock\n{\n    vec4 ";
LAB_00ae98d2:
    poVar2 = std::operator<<(&local_1a8,pcVar3);
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = ";\n};\n";
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
    pcVar3 = "uniform ";
LAB_00ae98fb:
    poVar2 = std::operator<<(&local_1a8,pcVar3);
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = "\n{\n    vec4 test;\n};\n";
    break;
  case LANGUAGE_FEATURE_VARYING:
    pcVar3 = "varying vec4 ";
LAB_00ae9a9a:
    poVar2 = std::operator<<(&local_1a8,pcVar3);
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = ";\n";
  }
  std::operator<<(poVar2,pcVar3);
switchD_00ae9759_caseD_10:
  std::operator<<(&local_1a8,"void main()\n{\n");
  switch(language_feature) {
  case LANGUAGE_FEATURE_SHARED_VARIABLE:
    pcVar3 = "shared vec4 ";
    break;
  case LANGUAGE_FEATURE_STRUCTURE_MEMBER:
    poVar2 = std::operator<<(&local_1a8,"struct\n{\n    vec4 ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    pcVar3 = ";\n} testInstance;\n";
    goto LAB_00ae9b71;
  case LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME:
    pcVar3 = "struct\n{\n    vec4 test;\n} ";
    break;
  case LANGUAGE_FEATURE_STRUCTURE_NAME:
    poVar2 = std::operator<<(&local_1a8,"struct ");
    poVar2 = std::operator<<(poVar2,invalid_name);
    poVar2 = std::operator<<(poVar2,"{\n    vec4 test;\n");
    pcVar3 = "};\n";
    goto LAB_00ae9b71;
  default:
    goto switchD_00ae9ae7_caseD_14;
  case LANGUAGE_FEATURE_VARIABLE:
    pcVar3 = "vec4 ";
  }
  poVar2 = std::operator<<(&local_1a8,pcVar3);
  poVar2 = std::operator<<(poVar2,invalid_name);
  pcVar3 = ";\n";
LAB_00ae9b71:
  std::operator<<(poVar2,pcVar3);
switchD_00ae9ae7_caseD_14:
  std::operator<<(&local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&body_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamesTest::getShaderBody(_shader_type shader_type, _language_feature language_feature,
											 const char* invalid_name) const
{
	std::stringstream	  body_sstream;
	const glu::ContextType context_type = m_context.getRenderContext().getType();

	/* Preamble: shader language version */
	body_sstream << "#version ";

	glu::ApiType apiType = context_type.getAPI();
	if (apiType == glu::ApiType::core(3, 1))
		body_sstream << "140";
	else if (apiType == glu::ApiType::core(3, 2))
		body_sstream << "150";
	else if (apiType == glu::ApiType::core(3, 3))
		body_sstream << "330";
	else if (apiType == glu::ApiType::core(4, 0))
		body_sstream << "400";
	else if (apiType == glu::ApiType::core(4, 1))
		body_sstream << "410";
	else if (apiType == glu::ApiType::core(4, 2))
		body_sstream << "420";
	else if (apiType == glu::ApiType::core(4, 3))
		body_sstream << "430";
	else if (apiType == glu::ApiType::core(4, 4))
		body_sstream << "440";
	else if (apiType == glu::ApiType::core(4, 5))
		body_sstream << "450";
	else
	{
		TCU_FAIL("Unsupported GL context version - please implement");
	}

	body_sstream << "\n\n";

	/* Preamble: layout qualifiers - required for CS, TC and TE shader stages */
	if (shader_type == SHADER_TYPE_COMPUTE)
	{
		body_sstream << "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n";
	}
	else if (shader_type == SHADER_TYPE_TESS_CONTROL)
	{
		body_sstream << "layout(vertices = 3) out;\n";
	}
	else if (shader_type == SHADER_TYPE_TESS_EVALUATION)
	{
		body_sstream << "layout(triangles) in;\n";
	}

	body_sstream << "\n\n";

	/* Language feature: insert incorrectly named atomic counter declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_ATOMIC_COUNTER)
	{
		body_sstream << "layout(binding = 0, offset = 0) uniform atomic_uint " << invalid_name << ";\n";
	}

	/* Language feature: insert incorrectly named attribute declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_ATTRIBUTE)
	{
		body_sstream << "attribute vec4 " << invalid_name << ";\n";
	}

	/* Language feature: insert incorrectly name constant declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_CONSTANT)
	{
		body_sstream << "const vec4 " << invalid_name << " = vec4(2.0, 3.0, 4.0, 5.0);\n";
	}

	/* Language feature: insert a function with incorrectly named argument if needed */
	if (language_feature == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)
	{
		body_sstream << "void test(in vec4 " << invalid_name << ")\n"
																"{\n"
																"}\n";
	}

	/* Language feature: insert incorrectly named function if needed */
	if (language_feature == LANGUAGE_FEATURE_FUNCTION_NAME)
	{
		body_sstream << "void " << invalid_name << "(in vec4 test)\n"
												   "{\n"
												   "}\n";
	}

	/* Language feature: insert incorrectly named input variable if needed */
	if (language_feature == LANGUAGE_FEATURE_INPUT)
	{
		body_sstream << "in vec4 " << invalid_name;

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named input block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "in testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name;

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an input block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME)
	{
		body_sstream << "in testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testBlockInstance";

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named input block */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
	{
		body_sstream << "in " << invalid_name << "\n"
												 "{\n"
												 "    vec4 test;\n"
												 "} testBlockInstance";

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert incorrectly named output variable if needed */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT)
	{
		body_sstream << "out vec4 " << invalid_name;

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named output block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "out testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name;

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an output block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME)
	{
		body_sstream << "out testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testBlockInstance";

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named output block */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
	{
		body_sstream << "out " << invalid_name << "\n"
												  "{\n"
												  "    vec4 test;\n"
												  "} testBlockInstance";

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named shader storage block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "buffer testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a shader storage block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME)
	{
		body_sstream << "buffer testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"};\n";
	}

	/* Language feature: insert declaration of an incorrectly named shader storage block */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME)
	{
		body_sstream << "buffer " << invalid_name << "\n"
													 "{\n"
													 "    vec4 test;\n"
													 "};\n";
	}

	/* Language feature: insert declaration of a subroutine function with invalid name */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME)
	{
		body_sstream << "subroutine void exampleSubroutine(inout vec4 " << invalid_name
					 << ");\n"
						"\n"
						"subroutine (exampleSubroutine) void invert(inout vec4 "
					 << invalid_name << ")\n"
										"{\n"
										"    "
					 << invalid_name << " += vec4(0.0, 1.0, 2.0, 3.0);\n"
										"}\n"
										"\n"
										"subroutine uniform exampleSubroutine testSubroutine;\n";
	}

	/* Language feature: insert declaration of a subroutine of incorrectly named type */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_TYPE)
	{
		body_sstream << "subroutine void " << invalid_name << "(inout vec4 arg);\n"
															  "\n"
															  "subroutine ("
					 << invalid_name << ") void invert(inout vec4 arg)\n"
										"{\n"
										"    arg += vec4(0.0, 1.0, 2.0, 3.0);\n"
										"}\n"
										"\n"
										"subroutine uniform "
					 << invalid_name << " testSubroutine;\n";
	}

	/* Language feature: insert declaration of a subroutine, followed by a declaration of
	 *                   an incorrectly named subroutine uniform.
	 */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_UNIFORM)
	{
		body_sstream << "subroutine void exampleSubroutine(inout vec4 arg);\n"
						"\n"
						"subroutine (exampleSubroutine) void invert(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(0.0, 1.0, 2.0, 3.0);\n"
						"}\n"
						"\n"
						"subroutine uniform exampleSubroutine "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform. */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM)
	{
		body_sstream << "uniform sampler2D " << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "uniform testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an uniform block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME)
	{
		body_sstream << "uniform testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"};\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform block */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)
	{
		body_sstream << "uniform " << invalid_name << "\n"
													  "{\n"
													  "    vec4 test;\n"
													  "};\n";
	}

	/* Language feature: insert declaration of an incorrectly named varying */
	if (language_feature == LANGUAGE_FEATURE_VARYING)
	{
		body_sstream << "varying vec4 " << invalid_name << ";\n";
	}

	/* Start implementation of the main entry-point. */
	body_sstream << "void main()\n"
					"{\n";

	/* Language feature: insert declaration of an incorrectly named shared variable. */
	if (language_feature == LANGUAGE_FEATURE_SHARED_VARIABLE)
	{
		body_sstream << "shared vec4 " << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a structure, whose instance name is incorrect */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME)
	{
		body_sstream << "struct\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a structure with one of its member variables being incorrectly named. */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_MEMBER)
	{
		body_sstream << "struct\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testInstance;\n";
	}

	/* Language feature: insert declaration of a structure whose name is incorrect */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_NAME)
	{
		body_sstream << "struct " << invalid_name << "{\n"
													 "    vec4 test;\n"
					 << "};\n";
	}

	/* Language feature: insert declaration of a variable with incorrect name. */
	if (language_feature == LANGUAGE_FEATURE_VARIABLE)
	{
		body_sstream << "vec4 " << invalid_name << ";\n";
	}

	/* Close the main entry-point implementation */
	body_sstream << "}\n";

	return body_sstream.str();
}